

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createTexture_ptex(SemanticParser *this,SP *in)

{
  long lVar1;
  size_type sVar2;
  bool bVar3;
  ostream *poVar4;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SP SVar5;
  string fileName;
  allocator<char> local_59;
  string local_58;
  string local_30;
  
  lVar1 = *in_RDX;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"filename",&local_59);
  syntactic::ParamSet::getParamString(&local_30,(ParamSet *)(lVar1 + 8),&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar3 = std::operator==(&local_30,"");
  if (bVar3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"warning: pbrt image texture, but no filename!?")
    ;
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::make_shared<pbrt::PtexFileTexture,std::__cxx11::string_const&>(&local_58);
  sVar2 = local_58._M_string_length;
  local_58._M_string_length = 0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_58._M_dataplus._M_p;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
  local_58._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  std::__cxx11::string::~string((string *)&local_30);
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_ptex(pbrt::syntactic::Texture::SP in)
  {
    const std::string fileName = in->getParamString("filename");
    if (fileName == "")
      std::cerr << "warning: pbrt image texture, but no filename!?" << std::endl;
    return std::make_shared<PtexFileTexture>(fileName);
  }